

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O3

int Ssw_ManSweepNodeFilter(Ssw_Man_t *p,Aig_Obj_t *pObj,int f)

{
  Aig_Obj_t **ppAVar1;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pAVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pOld;
  Aig_Obj_t *pAVar5;
  int iVar6;
  
  ppAVar1 = p->pAig->pReprs;
  iVar3 = 0;
  iVar6 = 0;
  if (ppAVar1 != (Aig_Obj_t **)0x0) {
    pRepr = ppAVar1[pObj->Id];
    iVar6 = iVar3;
    if (pRepr != (Aig_Obj_t *)0x0) {
      pAVar5 = p->pNodeToFrames[pObj->Id * p->nFrames + f];
      if ((pAVar5 == (Aig_Obj_t *)0x0) ||
         (pAVar2 = p->pNodeToFrames[p->nFrames * pRepr->Id + f], pAVar2 == (Aig_Obj_t *)0x0)) {
        __assert_fail("pObjFraig != NULL && pObjReprFraig != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswFilter.c"
                      ,0xc6,"int Ssw_ManSweepNodeFilter(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      pOld = (Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe);
      pAVar4 = (Aig_Obj_t *)((ulong)pAVar2 & 0xfffffffffffffffe);
      if ((((byte)((*(uint *)&pOld->field_0x18 ^ *(uint *)&pAVar4->field_0x18) >> 3) ^
            (byte)pAVar5 ^ (byte)pAVar2 ^
           ((*(uint *)&pRepr->field_0x18 ^ *(uint *)&pObj->field_0x18) & 8) == 0) & 1) == 0) {
        __assert_fail("(pObj->fPhase == pObjRepr->fPhase) == (Aig_ObjPhaseReal(pObjFraig) == Aig_ObjPhaseReal(pObjReprFraig))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswFilter.c"
                      ,199,"int Ssw_ManSweepNodeFilter(Ssw_Man_t *, Aig_Obj_t *, int)");
      }
      if (pOld != pAVar4) {
        pAVar5 = pAVar4;
        if (p->pFrames->pConst1 != pOld) {
          pAVar5 = pOld;
          pOld = pAVar4;
        }
        iVar3 = Ssw_NodesAreEquiv(p,pOld,pAVar5);
        if (iVar3 == -1) {
          iVar6 = 1;
        }
        else if (iVar3 == 1) {
          p->pNodeToFrames[pObj->Id * p->nFrames + f] =
               (Aig_Obj_t *)
               ((ulong)((*(uint *)&pRepr->field_0x18 ^ *(uint *)&pObj->field_0x18) >> 3 & 1) ^
               (ulong)pAVar2);
        }
        else {
          Ssw_SmlSavePatternAig(p,f);
          Ssw_ManResimulateBit(p,pObj,pRepr);
          ppAVar1 = p->pAig->pReprs;
          if ((ppAVar1 != (Aig_Obj_t **)0x0) && (ppAVar1[pObj->Id] == pRepr)) {
            __assert_fail("Aig_ObjRepr( p->pAig, pObj ) != pObjRepr",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswFilter.c"
                          ,0xde,"int Ssw_ManSweepNodeFilter(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int Ssw_ManSweepNodeFilter( Ssw_Man_t * p, Aig_Obj_t * pObj, int f )
{
    Aig_Obj_t * pObjRepr, * pObjFraig, * pObjFraig2, * pObjReprFraig;
    int RetValue;
    // get representative of this class
    pObjRepr = Aig_ObjRepr( p->pAig, pObj );
    if ( pObjRepr == NULL )
        return 0;
    // get the fraiged node
    pObjFraig = Ssw_ObjFrame( p, pObj, f );
    // get the fraiged representative
    pObjReprFraig = Ssw_ObjFrame( p, pObjRepr, f );
    // check if constant 0 pattern distinquishes these nodes
    assert( pObjFraig != NULL && pObjReprFraig != NULL );
    assert( (pObj->fPhase == pObjRepr->fPhase) == (Aig_ObjPhaseReal(pObjFraig) == Aig_ObjPhaseReal(pObjReprFraig)) );
    // if the fraiged nodes are the same, return
    if ( Aig_Regular(pObjFraig) == Aig_Regular(pObjReprFraig) )
        return 0;
    // call equivalence checking
    if ( Aig_Regular(pObjFraig) != Aig_ManConst1(p->pFrames) )
        RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
    else
        RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObjFraig), Aig_Regular(pObjReprFraig) );
    if ( RetValue == 1 )  // proved equivalent
    {
        pObjFraig2 = Aig_NotCond( pObjReprFraig, pObj->fPhase ^ pObjRepr->fPhase );
        Ssw_ObjSetFrame( p, pObj, f, pObjFraig2 );
        return 0;
    }
    if ( RetValue == -1 ) // timed out
    {
//        Ssw_ClassesRemoveNode( p->ppClasses, pObj );
        return 1;
    }
    // disproved equivalence
    Ssw_SmlSavePatternAig( p, f );
    Ssw_ManResimulateBit( p, pObj, pObjRepr );
    assert( Aig_ObjRepr( p->pAig, pObj ) != pObjRepr );
    if ( Aig_ObjRepr( p->pAig, pObj ) == pObjRepr )
    {
        Abc_Print( 1, "Ssw_ManSweepNodeFilter(): Failed to refine representative.\n" );
    }
    return 0;
}